

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O3

RSA * pkey_get_rsa(EVP_PKEY *key,RSA **rsa)

{
  RSA *pRVar1;
  
  if (key != (EVP_PKEY *)0x0) {
    pRVar1 = (RSA *)EVP_PKEY_get1_RSA((EVP_PKEY *)key);
    EVP_PKEY_free((EVP_PKEY *)key);
    if (pRVar1 != (RSA *)0x0) {
      if (rsa == (RSA **)0x0) {
        return pRVar1;
      }
      RSA_free((RSA *)*rsa);
      *rsa = pRVar1;
      return pRVar1;
    }
  }
  return (RSA *)0x0;
}

Assistant:

static RSA *pkey_get_rsa(EVP_PKEY *key, RSA **rsa) {
  RSA *rtmp;
  if (!key) {
    return NULL;
  }
  rtmp = EVP_PKEY_get1_RSA(key);
  EVP_PKEY_free(key);
  if (!rtmp) {
    return NULL;
  }
  if (rsa) {
    RSA_free(*rsa);
    *rsa = rtmp;
  }
  return rtmp;
}